

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamerTests.cpp
# Opt level: O2

void __thiscall TestNameResetter::~TestNameResetter(TestNameResetter *this)

{
  std::__cxx11::string::_M_assign((string *)ApprovalTests::TestName::directoryPrefix_abi_cxx11_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TestNameResetter()
    {
        TestName::directoryPrefix = oldPrefix_;
    }